

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::load(Application *this,SceneInfo *sceneInfo)

{
  Type TVar1;
  pointer pNVar2;
  LightInfo *light;
  double dVar3;
  double dVar4;
  double dVar5;
  PathTracer *pPVar6;
  PathTracer *pPVar7;
  undefined8 *puVar8;
  Scene *pSVar9;
  Matrix4x4 *transform;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  Application *this_00;
  Matrix4x4 *transform_00;
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  lights;
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  objects;
  LightInfo default_light;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  PathTracer *local_1c0;
  undefined1 local_1a8 [8];
  pointer ppSStack_1a0;
  pointer local_198;
  PathTracer *local_188;
  Scene *pSStack_180;
  undefined1 local_178 [16];
  pointer local_168;
  Vector4D local_158;
  PathTracer *local_138;
  Scene *pSStack_130;
  PathTracer *local_128;
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  local_118;
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  local_100;
  LightInfo local_e8;
  
  local_1a8 = (undefined1  [8])0x0;
  ppSStack_1a0 = (pointer)0x0;
  local_198 = (pointer)0x0;
  local_168 = (pointer)0x0;
  local_188 = (PathTracer *)0x0;
  pSStack_180 = (Scene *)0x0;
  local_178._0_8_ = (_Base_ptr)0x0;
  local_178._8_8_ = (_Base_ptr)0x0;
  uVar11 = (int)((long)(sceneInfo->nodes).
                       super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(sceneInfo->nodes).
                       super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3d70a3d7;
  if ((int)uVar11 < 1) {
    local_1d0 = 0.0;
    local_1d8 = 0.0;
    local_1c8 = 0.0;
  }
  else {
    uVar12 = (ulong)(uVar11 & 0x7fffffff);
    local_1c0 = (PathTracer *)0x0;
    lVar10 = 0x48;
    local_1d0 = 0.0;
    local_1d8 = 0.0;
    local_1c8 = 0.0;
    this_00 = this;
    do {
      pNVar2 = (sceneInfo->nodes).
               super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      light = *(LightInfo **)((long)(pNVar2->transform).entries + lVar10 + 0xffffffffffffffb0U);
      TVar1 = (light->super_Instance).type;
      if (TVar1 < MATERIAL) {
        transform_00 = (Matrix4x4 *)((long)(pNVar2->transform).entries + lVar10 + -0x48);
        switch(TVar1) {
        case CAMERA:
          local_158.x = (double)local_188;
          local_158.y = (double)pSStack_180;
          local_158.z = (double)local_1c0;
          local_158.w = 1.0;
          Matrix4x4::operator*(transform_00,&local_158);
          Vector4D::to3D((Vector4D *)&local_e8);
          local_188 = local_138;
          pSStack_180 = pSStack_130;
          local_1c0 = local_128;
          local_158.x._0_4_ = light->light_type;
          local_158.x._4_4_ = (light->spectrum).r;
          local_158.y._0_4_ = (light->spectrum).g;
          local_158.y._4_4_ = (light->spectrum).b;
          local_158.z = (light->position).x;
          local_158.w = 1.0;
          Matrix4x4::operator*(transform_00,&local_158);
          Vector4D::to3D((Vector4D *)&local_e8);
          pPVar7 = local_128;
          pSVar9 = pSStack_130;
          pPVar6 = local_138;
          this_00 = this;
          init_camera(this,(CameraInfo *)light,transform);
          local_1d0 = 1.0 / SQRT((double)pPVar7 * (double)pPVar7 +
                                 (double)pPVar6 * (double)pPVar6 + (double)pSVar9 * (double)pSVar9);
          local_1c8 = (double)pPVar6 * local_1d0;
          local_1d8 = (double)pSVar9 * local_1d0;
          local_1d0 = local_1d0 * (double)pPVar7;
          break;
        case LIGHT:
          local_e8.super_Instance._0_8_ = init_light(this_00,light,transform_00);
          this_00 = (Application *)local_1a8;
          std::
          vector<CMU462::DynamicScene::SceneLight*,std::allocator<CMU462::DynamicScene::SceneLight*>>
          ::emplace_back<CMU462::DynamicScene::SceneLight*>
                    ((vector<CMU462::DynamicScene::SceneLight*,std::allocator<CMU462::DynamicScene::SceneLight*>>
                      *)this_00,(SceneLight **)&local_e8);
          break;
        case SPHERE:
          local_e8.super_Instance._0_8_ = init_sphere(this_00,(SphereInfo *)light,transform_00);
          this_00 = (Application *)local_178;
          std::
          vector<CMU462::DynamicScene::SceneObject*,std::allocator<CMU462::DynamicScene::SceneObject*>>
          ::emplace_back<CMU462::DynamicScene::SceneObject*>
                    ((vector<CMU462::DynamicScene::SceneObject*,std::allocator<CMU462::DynamicScene::SceneObject*>>
                      *)this_00,(SceneObject **)&local_e8);
          break;
        case POLYMESH:
          local_e8.super_Instance._0_8_ = init_polymesh(this_00,(PolymeshInfo *)light,transform_00);
          this_00 = (Application *)local_178;
          std::
          vector<CMU462::DynamicScene::SceneObject*,std::allocator<CMU462::DynamicScene::SceneObject*>>
          ::emplace_back<CMU462::DynamicScene::SceneObject*>
                    ((vector<CMU462::DynamicScene::SceneObject*,std::allocator<CMU462::DynamicScene::SceneObject*>>
                      *)this_00,(SceneObject **)&local_e8);
        }
      }
      lVar10 = lVar10 + 200;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    if ((undefined1  [8])ppSStack_1a0 != local_1a8) goto LAB_00188eeb;
  }
  Collada::LightInfo::LightInfo(&local_e8);
  puVar8 = (undefined8 *)operator_new(0x18);
  *puVar8 = &PTR_get_static_light_0026c2d8;
  puVar8[1] = local_e8.spectrum._0_8_;
  *(float *)(puVar8 + 2) = local_e8.spectrum.b;
  local_158.x = (double)puVar8;
  std::vector<CMU462::DynamicScene::SceneLight*,std::allocator<CMU462::DynamicScene::SceneLight*>>::
  emplace_back<CMU462::DynamicScene::SceneLight*>
            ((vector<CMU462::DynamicScene::SceneLight*,std::allocator<CMU462::DynamicScene::SceneLight*>>
              *)local_1a8,(SceneLight **)&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_Instance.name._M_dataplus._M_p != &local_e8.super_Instance.name.field_2) {
    operator_delete(local_e8.super_Instance.name._M_dataplus._M_p,
                    local_e8.super_Instance.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_Instance.id._M_dataplus._M_p != &local_e8.super_Instance.id.field_2) {
    operator_delete(local_e8.super_Instance.id._M_dataplus._M_p,
                    local_e8.super_Instance.id.field_2._M_allocated_capacity + 1);
  }
LAB_00188eeb:
  pSVar9 = (Scene *)operator_new(0x128);
  std::
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::vector(&local_100,
           (vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
            *)local_178);
  std::
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>::
  vector(&local_118,
         (vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
          *)local_1a8);
  DynamicScene::Scene::Scene(pSVar9,&local_100,&local_118);
  this->scene = pSVar9;
  if (local_118.
      super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.
      super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  DynamicScene::Scene::get_bbox((BBox *)&local_e8,this->scene);
  if ((((double)local_e8.super_Instance.id.field_2._M_allocated_capacity <=
        (double)local_e8.super_Instance._0_8_) &&
      ((double)local_e8.super_Instance.id.field_2._8_8_ <=
       (double)local_e8.super_Instance.id._M_dataplus._M_p)) &&
     ((double)local_e8.super_Instance.name._M_dataplus._M_p <=
      (double)local_e8.super_Instance.id._M_string_length)) {
    local_158.z = ((double)local_e8.super_Instance.name._M_dataplus._M_p +
                  (double)local_e8.super_Instance.id._M_string_length) * 0.5;
    dVar5 = ((double)local_e8.super_Instance.id._M_dataplus._M_p +
            (double)local_e8.super_Instance.id.field_2._8_8_) * 0.5;
    local_158.y._0_4_ = SUB84(dVar5,0);
    local_158.x = ((double)local_e8.super_Instance._0_8_ +
                  (double)local_e8.super_Instance.id.field_2._M_allocated_capacity) * 0.5;
    local_158.y._4_4_ = (int)((ulong)dVar5 >> 0x20);
    dVar5 = SQRT((double)local_e8.super_Instance.name.field_2._8_8_ *
                 (double)local_e8.super_Instance.name.field_2._8_8_ +
                 (double)local_e8.super_Instance.name._M_string_length *
                 (double)local_e8.super_Instance.name._M_string_length +
                 (double)local_e8.super_Instance.name.field_2._M_allocated_capacity *
                 (double)local_e8.super_Instance.name.field_2._0_8_) * 0.5 * 1.5;
    this->canonical_view_distance = dVar5;
    local_188 = (PathTracer *)(dVar5 + dVar5);
    dVar3 = acos(local_1d8);
    dVar4 = atan2(local_1c8,local_1d0);
    Camera::place(&this->canonicalCamera,(Vector3D *)&local_158,dVar3,dVar4,(double)local_188,
                  dVar5 / 10.0,dVar5 * 20.0);
    dVar3 = acos(local_1d8);
    dVar4 = atan2(local_1c8,local_1d0);
    Camera::place(&this->camera,(Vector3D *)&local_158,dVar3,dVar4,(double)local_188,dVar5 / 10.0,
                  dVar5 * 20.0);
    this->scroll_rate = this->canonical_view_distance / 10.0;
  }
  DynamicScene::Scene::set_draw_styles
            (this->scene,&this->defaultStyle,&this->hoverStyle,&this->selectStyle);
  if ((_Base_ptr)local_178._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_178._0_8_,(long)local_168 - local_178._0_8_);
  }
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,(long)local_198 - (long)local_1a8);
  }
  return;
}

Assistant:

void Application::load(SceneInfo* sceneInfo) {

  vector<Collada::Node>& nodes = sceneInfo->nodes;
  vector<DynamicScene::SceneLight *> lights;
  vector<DynamicScene::SceneObject *> objects;

  // save camera position to update camera control later
  CameraInfo *c;
  Vector3D c_pos = Vector3D();
  Vector3D c_dir = Vector3D();

  int len = nodes.size();
  for (int i = 0; i < len; i++) {
    Collada::Node& node = nodes[i];
    Collada::Instance *instance = node.instance;
    const Matrix4x4& transform = node.transform;

    switch(instance->type) {
      case Collada::Instance::CAMERA:
        c = static_cast<CameraInfo*>(instance);
        c_pos = (transform * Vector4D(c_pos,1)).to3D();
        c_dir = (transform * Vector4D(c->view_dir,1)).to3D().unit();
        init_camera(*c, transform);
        break;
      case Collada::Instance::LIGHT:
      {
        lights.push_back(
          init_light(static_cast<LightInfo&>(*instance), transform));
        break;
      }
      case Collada::Instance::SPHERE:
        objects.push_back(
          init_sphere(static_cast<SphereInfo&>(*instance), transform));
        break;
      case Collada::Instance::POLYMESH:
        objects.push_back(
          init_polymesh(static_cast<PolymeshInfo&>(*instance), transform));
        break;
      case Collada::Instance::MATERIAL:
        init_material(static_cast<MaterialInfo&>(*instance));
        break;
     }
  }

  if (lights.size() == 0) { // no lights, default use ambient_light
    LightInfo default_light = LightInfo();
    lights.push_back(new DynamicScene::AmbientLight(default_light));
  }
  scene = new DynamicScene::Scene(objects, lights);

  const BBox& bbox = scene->get_bbox();
  if (!bbox.empty()) {

    Vector3D target = bbox.centroid();
    canonical_view_distance = bbox.extent.norm() / 2 * 1.5;

    double view_distance = canonical_view_distance * 2;
    double min_view_distance = canonical_view_distance / 10.0;
    double max_view_distance = canonical_view_distance * 20.0;

    canonicalCamera.place(target,
                          acos(c_dir.y),
                          atan2(c_dir.x, c_dir.z),
                          view_distance,
                          min_view_distance,
                          max_view_distance);

    camera.place(target,
                acos(c_dir.y),
                atan2(c_dir.x, c_dir.z),
                view_distance,
                min_view_distance,
                max_view_distance);

    set_scroll_rate();
  }

  // set default draw styles for meshEdit -
  scene->set_draw_styles(&defaultStyle, &hoverStyle, &selectStyle);

  // cerr << "==================================" << endl;
  // cerr << "CAMERA" << endl;
  // cerr << "      hFov: " << camera.hFov << endl;
  // cerr << "      vFov: " << camera.vFov << endl;
  // cerr << "        ar: " << camera.ar << endl;
  // cerr << "     nClip: " << camera.nClip << endl;
  // cerr << "     fClip: " << camera.fClip << endl;
  // cerr << "       pos: " << camera.pos << endl;
  // cerr << " targetPos: " << camera.targetPos << endl;
  // cerr << "       phi: " << camera.phi << endl;
  // cerr << "     theta: " << camera.theta << endl;
  // cerr << "         r: " << camera.r << endl;
  // cerr << "      minR: " << camera.minR << endl;
  // cerr << "      maxR: " << camera.maxR << endl;
  // cerr << "       c2w: " << camera.c2w << endl;
  // cerr << "   screenW: " << camera.screenW << endl;
  // cerr << "   screenH: " << camera.screenH << endl;
  // cerr << "screenDist: " << camera.screenDist<< endl;
  // cerr << "==================================" << endl;
}